

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.cpp
# Opt level: O3

void __thiscall Lodtalk::StackMemory::~StackMemory(StackMemory *this)

{
  pointer ppSVar1;
  StackPage *this_00;
  pointer ppSVar2;
  
  if (this->stackMemoryLowest != (uint8_t *)0x0) {
    operator_delete__(this->stackMemoryLowest);
  }
  ppSVar1 = (this->stackPages).
            super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppSVar2 = (this->stackPages).
                 super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppSVar2 != ppSVar1; ppSVar2 = ppSVar2 + 1
      ) {
    this_00 = *ppSVar2;
    if (this_00 != (StackPage *)0x0) {
      StackPage::~StackPage(this_00);
    }
    operator_delete(this_00);
  }
  ppSVar2 = (this->freePages).
            super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar2 != (pointer)0x0) {
    operator_delete(ppSVar2);
  }
  ppSVar2 = (this->stackPages).
            super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar2 != (pointer)0x0) {
    operator_delete(ppSVar2);
    return;
  }
  return;
}

Assistant:

StackMemory::~StackMemory()
{
    delete[] stackMemoryLowest;

    for (auto page : stackPages)
        delete page;
}